

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O2

bool __thiscall Date::is_valid(Date *this)

{
  Month MVar1;
  uint uVar2;
  bool bVar3;
  
  if (this->y < 1) {
    return false;
  }
  MVar1 = this->m;
  uVar2 = this->d;
  if ((int)uVar2 < 1 || 0xb < MVar1 - jan) {
    return false;
  }
  if (MVar1 < dec) {
    if ((0xa50U >> (MVar1 & 0x1f) & 1) != 0) {
      if (uVar2 < 0x1f) {
        return true;
      }
      goto LAB_00102482;
    }
    if (MVar1 != feb) goto LAB_00102476;
  }
  else {
LAB_00102476:
    if (uVar2 < 0x20) {
      return true;
    }
    if (MVar1 != feb) goto LAB_00102482;
  }
  bVar3 = is_leap(this->y);
  if (bVar3 && uVar2 < 0x1e) {
    return true;
  }
LAB_00102482:
  return uVar2 < 0x1d;
}

Assistant:

bool Date::is_valid()
{
	bool is_valid = y > 0 && (int(m) > 0 && int(m) < 13) && d > 0;
	is_valid = is_valid && (
		(is_31_day_month(m) && d < 32) ||
		(is_30_day_month(m) && d < 31) ||
		(m == Month::feb && (is_leap(y) && d < 30) || d < 29)
		);
	return is_valid;
}